

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_writer.cpp
# Opt level: O3

void __thiscall duckdb::ParquetWriter::FlushRowGroup(ParquetWriter *this,PreparedRowGroup *prepared)

{
  int64_t *piVar1;
  idx_t iVar2;
  pointer pcVar3;
  int iVar4;
  unsigned_long uVar5;
  long lVar6;
  reference this_00;
  reference pvVar7;
  pointer pCVar8;
  type pCVar9;
  const_reference pvVar10;
  unsigned_long uVar11;
  __int_type _Var12;
  IOException *pIVar13;
  undefined8 extraout_RAX;
  InternalException *this_01;
  size_type __n;
  size_type __n_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  string local_98;
  undefined8 local_78;
  idx_t local_70;
  pthread_mutex_t *local_68;
  unique_ptr<duckdb::BufferedFileWriter,_std::default_delete<duckdb::BufferedFileWriter>,_true>
  *local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  vector<duckdb_parquet::ColumnChunk,_true> *local_38;
  
  local_68 = (pthread_mutex_t *)&this->lock;
  iVar4 = pthread_mutex_lock(local_68);
  if (iVar4 == 0) {
    if ((prepared->states).
        super_vector<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        (prepared->states).
        super_vector<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      local_60 = &this->writer;
      unique_ptr<duckdb::BufferedFileWriter,_std::default_delete<duckdb::BufferedFileWriter>,_true>
      ::operator->(local_60);
      uVar5 = duckdb::BufferedFileWriter::GetTotalWritten();
      lVar6 = NumericCastImpl<long,_unsigned_long,_false>::Convert(uVar5);
      (prepared->row_group).file_offset = lVar6;
      if ((prepared->states).
          super_vector<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>_>_>
          .
          super__Vector_base<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          (prepared->states).
          super_vector<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>_>_>
          .
          super__Vector_base<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        __n_00 = 0;
        do {
          this_00 = vector<duckdb::unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>,_true>
                    ::operator[](&this->column_writers,__n_00);
          pvVar7 = vector<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>,_true>
                   ::operator[](&prepared->states,__n_00);
          local_98._M_dataplus._M_p =
               (pointer)(pvVar7->
                        super_unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>_>
                        )._M_t.
                        super___uniq_ptr_impl<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_duckdb::ColumnWriterState_*,_std::default_delete<duckdb::ColumnWriterState>_>
                        .super__Head_base<0UL,_duckdb::ColumnWriterState_*,_false>._M_head_impl;
          (pvVar7->
          super_unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>_>
          )._M_t.
          super___uniq_ptr_impl<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::ColumnWriterState_*,_std::default_delete<duckdb::ColumnWriterState>_>
          .super__Head_base<0UL,_duckdb::ColumnWriterState_*,_false>._M_head_impl =
               (ColumnWriterState *)0x0;
          pCVar8 = unique_ptr<duckdb::ColumnWriter,_std::default_delete<duckdb::ColumnWriter>,_true>
                   ::operator->(this_00);
          pCVar9 = unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>
                   ::operator*((unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>
                                *)&local_98);
          (*pCVar8->_vptr_ColumnWriter[9])(pCVar8,pCVar9);
          if ((ColumnWriterState *)local_98._M_dataplus._M_p != (ColumnWriterState *)0x0) {
            (**(code **)(*(long *)local_98._M_dataplus._M_p + 8))();
          }
          __n_00 = __n_00 + 1;
        } while (__n_00 < (ulong)((long)(prepared->states).
                                        super_vector<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>_>_>
                                        .
                                        super__Vector_base<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(prepared->states).
                                        super_vector<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>_>_>
                                        .
                                        super__Vector_base<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnWriterState,_std::default_delete<duckdb::ColumnWriterState>,_true>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 3));
      }
      unique_ptr<duckdb::BufferedFileWriter,_std::default_delete<duckdb::BufferedFileWriter>,_true>
      ::operator->(local_60);
      local_70 = duckdb::BufferedFileWriter::GetTotalWritten();
      if ((prepared->row_group).columns.
          super_vector<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>.
          super__Vector_base<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          (prepared->row_group).columns.
          super_vector<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>.
          super__Vector_base<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        local_78 = &this->file_name;
        local_38 = &(prepared->row_group).columns;
        __n = 0;
        do {
          paVar14 = &local_98.field_2;
          pvVar10 = vector<duckdb_parquet::ColumnChunk,_true>::operator[](local_38,__n);
          iVar2 = (pvVar10->meta_data).data_page_offset;
          local_98._M_dataplus._M_p = (pointer)paVar14;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"data page offset","")
          ;
          ValidateOffsetInFile(local_78,__n,local_70,iVar2,&local_98);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != paVar14) {
            operator_delete(local_98._M_dataplus._M_p);
          }
          uVar5 = NumericCastImpl<unsigned_long,_long,_false>::Convert
                            ((pvVar10->meta_data).data_page_offset);
          if (((byte)(pvVar10->meta_data).__isset & 4) != 0) {
            iVar2 = (pvVar10->meta_data).dictionary_page_offset;
            local_58._M_dataplus._M_p = (pointer)0x16;
            local_98._M_dataplus._M_p = (pointer)paVar14;
            local_98._M_dataplus._M_p =
                 (pointer)std::__cxx11::string::_M_create((ulong *)&local_98,(ulong)&local_58);
            local_98.field_2._M_allocated_capacity = (size_type)local_58._M_dataplus._M_p;
            ((ColumnWriterState *)local_98._M_dataplus._M_p)->_vptr_ColumnWriterState =
                 (_func_int **)0x616e6f6974636964;
            (((ColumnWriterState *)local_98._M_dataplus._M_p)->definition_levels).
            super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
            super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x2065676170207972;
            *(undefined8 *)
             ((long)&(((ColumnWriterState *)local_98._M_dataplus._M_p)->definition_levels).
                     super_vector<unsigned_short,_std::allocator<unsigned_short>_>.
                     super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
                     super__Vector_impl_data._M_start + 6) = 0x74657366666f2065;
            local_98._M_string_length = (size_type)local_58._M_dataplus._M_p;
            local_58._M_dataplus._M_p[(long)local_98._M_dataplus._M_p] = '\0';
            ValidateOffsetInFile(local_78,__n,local_70,iVar2,&local_98);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_98._M_dataplus._M_p != &local_98.field_2) {
              operator_delete(local_98._M_dataplus._M_p);
            }
            uVar11 = NumericCastImpl<unsigned_long,_long,_false>::Convert
                               ((pvVar10->meta_data).dictionary_page_offset);
            if (uVar5 <= uVar11) {
              pIVar13 = (IOException *)__cxa_allocate_exception(0x10);
              local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_98,
                         "Parquet file \'%s\': metadata is corrupt. Dictionary page (offset=%llu) must come before any data pages (offset=%llu)."
                         ,"");
              local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
              pcVar3 = (this->file_name)._M_dataplus._M_p;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_58,pcVar3,pcVar3 + (this->file_name)._M_string_length);
              IOException::IOException<std::__cxx11::string,long,unsigned_long>
                        (pIVar13,&local_98,&local_58,(pvVar10->meta_data).dictionary_page_offset,
                         uVar5);
              __cxa_throw(pIVar13,&IOException::typeinfo,std::runtime_error::~runtime_error);
            }
            uVar5 = (pvVar10->meta_data).dictionary_page_offset;
          }
          uVar11 = NumericCastImpl<unsigned_long,_long,_false>::Convert
                             ((pvVar10->meta_data).total_compressed_size);
          if (local_70 <= (uVar11 + uVar5) - 1) {
            pIVar13 = (IOException *)__cxa_allocate_exception(0x10);
            local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_98,
                       "Parquet file \'%s\': metadata is corrupt. Column %llu has invalid column offsets (offset=%llu, size=%llu, file_size=%llu)."
                       ,"");
            local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
            pcVar3 = (this->file_name)._M_dataplus._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_58,pcVar3,pcVar3 + (this->file_name)._M_string_length);
            local_78._0_4_ = (int)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
            IOException::
            IOException<std::__cxx11::string,unsigned_long,unsigned_long,unsigned_long,unsigned_long>
                      (pIVar13,&local_98,&local_58,__n,uVar5,uVar11,local_70);
            local_78 = (string *)((ulong)local_78._4_4_ << 0x20);
            __cxa_throw(pIVar13,&IOException::typeinfo,std::runtime_error::~runtime_error);
          }
          __n = __n + 1;
        } while (__n < (ulong)(((long)(prepared->row_group).columns.
                                      super_vector<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>
                                      .
                                      super__Vector_base<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(prepared->row_group).columns.
                                      super_vector<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>
                                      .
                                      super__Vector_base<duckdb_parquet::ColumnChunk,_std::allocator<duckdb_parquet::ColumnChunk>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 7) *
                              -0x3333333333333333));
      }
      std::vector<duckdb_parquet::RowGroup,_std::allocator<duckdb_parquet::RowGroup>_>::push_back
                (&(this->file_meta_data).row_groups.
                  super_vector<duckdb_parquet::RowGroup,_std::allocator<duckdb_parquet::RowGroup>_>,
                 &prepared->row_group);
      piVar1 = &(this->file_meta_data).num_rows;
      *piVar1 = *piVar1 + (prepared->row_group).num_rows;
      unique_ptr<duckdb::BufferedFileWriter,_std::default_delete<duckdb::BufferedFileWriter>,_true>
      ::operator->(local_60);
      _Var12 = duckdb::BufferedFileWriter::GetTotalWritten();
      LOCK();
      (this->total_written).super___atomic_base<unsigned_long>._M_i = _Var12;
      UNLOCK();
      LOCK();
      (this->num_row_groups).super___atomic_base<unsigned_long>._M_i =
           (this->num_row_groups).super___atomic_base<unsigned_long>._M_i + 1;
      UNLOCK();
      pthread_mutex_unlock(local_68);
      return;
    }
  }
  else {
    std::__throw_system_error(iVar4);
  }
  this_01 = (InternalException *)__cxa_allocate_exception(0x10);
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_98,"Attempting to flush a row group with no rows","");
  duckdb::InternalException::InternalException(this_01,(string *)&local_98);
  __cxa_throw(this_01,&InternalException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void ParquetWriter::FlushRowGroup(PreparedRowGroup &prepared) {
	lock_guard<mutex> glock(lock);
	auto &row_group = prepared.row_group;
	auto &states = prepared.states;
	if (states.empty()) {
		throw InternalException("Attempting to flush a row group with no rows");
	}
	row_group.file_offset = NumericCast<int64_t>(writer->GetTotalWritten());
	for (idx_t col_idx = 0; col_idx < states.size(); col_idx++) {
		const auto &col_writer = column_writers[col_idx];
		auto write_state = std::move(states[col_idx]);
		col_writer->FinalizeWrite(*write_state);
	}
	// let's make sure all offsets are ay-okay
	ValidateColumnOffsets(file_name, writer->GetTotalWritten(), row_group);

	// append the row group to the file meta data
	file_meta_data.row_groups.push_back(row_group);
	file_meta_data.num_rows += row_group.num_rows;

	total_written = writer->GetTotalWritten();
	num_row_groups++;
}